

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_extension_instances_free(ly_ctx *ctx,lys_ext_instance **e,uint size)

{
  LY_STMT stmt;
  lyext_plugin *plVar1;
  lys_node *plVar2;
  long lVar3;
  lys_ext *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  undefined8 *puVar7;
  lys_tpdf *plVar8;
  long lVar9;
  lys_node *node;
  lys_tpdf *tpdf;
  lys_ext_instance *plVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  lyext_substmt *local_60;
  ulong local_58;
  lys_ext *local_50;
  uint local_44;
  ulong local_40;
  lys_ext_instance **local_38;
  
  if ((e != (lys_ext_instance **)0x0 && size != 0) && (*e != (lys_ext_instance *)0x0)) {
    uVar12 = (ulong)size;
    uVar11 = 0;
    local_58 = uVar12;
    local_38 = e;
LAB_0015092f:
    if (uVar11 != uVar12) {
      plVar10 = e[uVar11];
      if (plVar10 != (lys_ext_instance *)0x0) {
        if ((plVar10->flags & 1) == 0) {
          if ((plVar10->flags & 2) != 0) {
            free(plVar10->def);
            e[uVar11]->def = (lys_ext *)0x0;
            yang_free_ext_data((yang_ext_substmt *)e[uVar11]->parent);
            plVar10 = e[uVar11];
          }
          lys_extension_instances_free(ctx,plVar10->ext,(uint)plVar10->ext_size);
          lydict_remove(ctx,e[uVar11]->arg_value);
          plVar10 = e[uVar11];
        }
        if (((plVar10->def != (lys_ext *)0x0) &&
            (plVar1 = plVar10->def->plugin, plVar1 != (lyext_plugin *)0x0)) &&
           (plVar1->type == LYEXT_COMPLEX)) {
          local_50 = plVar10[1].def;
          local_44 = 0;
          local_40 = uVar11;
          do {
            plVar4 = local_50;
            lVar9 = (ulong)local_44 * 0x18;
            stmt = *(LY_STMT *)(local_50->padding + lVar9 + -0x1b);
            switch(stmt) {
            case LY_STMT_UNKNOWN:
              goto switchD_00150ee1_caseD_0;
            case LY_STMT_ARGUMENT:
            case LY_STMT_BASE:
            case LY_STMT_BELONGSTO:
            case LY_STMT_CONTACT:
            case LY_STMT_DEFAULT:
            case LY_STMT_DESCRIPTION:
            case LY_STMT_ERRTAG:
            case LY_STMT_ERRMSG:
            case LY_STMT_KEY:
            case LY_STMT_NAMESPACE:
            case LY_STMT_ORGANIZATION:
            case LY_STMT_PATH:
            case LY_STMT_PREFIX:
            case LY_STMT_PRESENCE:
            case LY_STMT_REFERENCE:
            case LY_STMT_REVISIONDATE:
            case LY_STMT_UNITS:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (stmt,(lys_ext_instance_complex *)local_38[local_40],&local_60);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (pcVar13 = (char *)*puVar5, pcVar13 != (char *)0x0)) {
                if (LY_STMT_CARD_MAND < local_60->cardinality) {
                  for (; *(char **)pcVar13 != (char *)0x0; pcVar13 = pcVar13 + 8) {
                    lydict_remove(ctx,*(char **)pcVar13);
                  }
                  free((void *)*puVar5);
                  if (stmt != LY_STMT_ARGUMENT) {
                    if (stmt != LY_STMT_BELONGSTO) break;
                    for (puVar7 = (undefined8 *)puVar5[1]; (char *)*puVar7 != (char *)0x0;
                        puVar7 = puVar7 + 1) {
                      lydict_remove(ctx,(char *)*puVar7);
                    }
                  }
                  tpdf = (lys_tpdf *)puVar5[1];
                  goto LAB_00150eae;
                }
                lydict_remove(ctx,pcVar13);
                if (stmt == LY_STMT_BELONGSTO) {
                  lydict_remove(ctx,(char *)puVar5[1]);
                }
              }
              break;
            case LY_STMT_VALUE:
            case LY_STMT_MAX:
            case LY_STMT_MIN:
            case LY_STMT_POSITION:
              plVar10 = local_38[local_40];
              lVar3 = *(long *)(local_50->padding + lVar9 + -0x13);
              tpdf = *(lys_tpdf **)((long)&plVar10[1].arg_value + lVar3 + 4);
              if (1 < *(uint *)(local_50->padding + lVar9 + -0xb)) {
                if (tpdf == (lys_tpdf *)0x0) {
                  tpdf = (lys_tpdf *)0x0;
                }
                else {
                  uVar11 = 0;
                  while( true ) {
                    if (*(void **)(tpdf->padding + uVar11 * 8 + -0x1c) == (void *)0x0) break;
                    free(*(void **)(tpdf->padding + uVar11 * 8 + -0x1c));
                    uVar11 = (ulong)((int)uVar11 + 1);
                    tpdf = *(lys_tpdf **)((long)&plVar10[1].arg_value + lVar3 + 4);
                  }
                }
              }
LAB_00150eae:
              free(tpdf);
              break;
            case LY_STMT_DIGITS:
            case LY_STMT_MODULE:
              if (1 < *(uint *)(local_50->padding + lVar9 + -0xb)) {
                tpdf = *(lys_tpdf **)
                        ((long)&local_38[local_40][1].arg_value +
                        *(long *)(local_50->padding + lVar9 + -0x13) + 4);
                goto LAB_00150eae;
              }
              break;
            case LY_STMT_UNIQUE:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (LY_STMT_UNIQUE,(lys_ext_instance_complex *)local_38[local_40],
                                  (lyext_substmt **)0x0);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (tpdf = (lys_tpdf *)*puVar5, tpdf != (lys_tpdf *)0x0)) {
                plVar8 = tpdf;
                if (*(uint *)(plVar4->padding + lVar9 + -0xb) < 2) {
                  for (uVar11 = 0; uVar11 < *(byte *)&tpdf->dsc; uVar11 = uVar11 + 1) {
                    lydict_remove(ctx,*(char **)(tpdf->name + uVar11 * 8));
                    tpdf = (lys_tpdf *)*puVar5;
                  }
                  free(tpdf->name);
                  tpdf = (lys_tpdf *)*puVar5;
                }
                else {
                  for (; pcVar13 = plVar8->name, pcVar13 != (char *)0x0;
                      plVar8 = (lys_tpdf *)&plVar8->dsc) {
                    for (uVar11 = 0; uVar11 < (byte)pcVar13[8]; uVar11 = uVar11 + 1) {
                      lydict_remove(ctx,*(char **)((long)*(void **)pcVar13 + uVar11 * 8));
                      pcVar13 = plVar8->name;
                    }
                    free(*(void **)pcVar13);
                    free(plVar8->name);
                  }
                }
                goto LAB_00150eae;
              }
              break;
            case LY_STMT_ACTION:
            case LY_STMT_ANYDATA:
            case LY_STMT_ANYXML:
            case LY_STMT_CASE:
            case LY_STMT_CHOICE:
            case LY_STMT_CONTAINER:
            case LY_STMT_GROUPING:
            case LY_STMT_INPUT:
            case LY_STMT_LEAF:
            case LY_STMT_LEAFLIST:
            case LY_STMT_LIST:
            case LY_STMT_NOTIFICATION:
            case LY_STMT_OUTPUT:
            case LY_STMT_USES:
            case LY_STMT_RPC:
              plVar10 = local_38[local_40];
              lVar9 = *(long *)(local_50->padding + lVar9 + -0x13);
              node = *(lys_node **)((long)&plVar10[1].arg_value + lVar9 + 4);
              while (node != (lys_node *)0x0) {
                plVar2 = node->next;
                lys_node_free(node,(_func_void_lys_node_ptr_void_ptr *)0x0,0);
                node = plVar2;
              }
              *(undefined8 *)((long)&plVar10[1].arg_value + lVar9 + 4) = 0;
              break;
            case LY_STMT_TYPEDEF:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (LY_STMT_TYPEDEF,(lys_ext_instance_complex *)local_38[local_40],
                                  (lyext_substmt **)0x0);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (tpdf = (lys_tpdf *)*puVar5, tpdf != (lys_tpdf *)0x0)) {
                plVar8 = tpdf;
                if (*(uint *)(plVar4->padding + lVar9 + -0xb) < 2) {
                  lys_tpdf_free(ctx,tpdf);
LAB_00150eab:
                  tpdf = (lys_tpdf *)*puVar5;
                }
                else {
                  for (; (lys_tpdf *)plVar8->name != (lys_tpdf *)0x0;
                      plVar8 = (lys_tpdf *)&plVar8->dsc) {
                    lys_tpdf_free(ctx,(lys_tpdf *)plVar8->name);
                    free(plVar8->name);
                  }
                }
                goto LAB_00150eae;
              }
              break;
            case LY_STMT_TYPE:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (LY_STMT_TYPE,(lys_ext_instance_complex *)local_38[local_40],
                                  (lyext_substmt **)0x0);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (tpdf = (lys_tpdf *)*puVar5, tpdf != (lys_tpdf *)0x0)) {
                plVar8 = tpdf;
                if (*(uint *)(plVar4->padding + lVar9 + -0xb) < 2) {
                  lys_type_free(ctx,(lys_type *)tpdf);
                  goto LAB_00150eab;
                }
                for (; (lys_type *)plVar8->name != (lys_type *)0x0;
                    plVar8 = (lys_tpdf *)&plVar8->dsc) {
                  lys_type_free(ctx,(lys_type *)plVar8->name);
                  free(plVar8->name);
                }
                goto LAB_00150eae;
              }
              break;
            case LY_STMT_IFFEATURE:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (LY_STMT_IFFEATURE,(lys_ext_instance_complex *)local_38[local_40],
                                  (lyext_substmt **)0x0);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (tpdf = (lys_tpdf *)*puVar5, tpdf != (lys_tpdf *)0x0)) {
                plVar8 = tpdf;
                if (1 < *(uint *)(plVar4->padding + lVar9 + -0xb)) {
                  for (; (lys_iffeature *)plVar8->name != (lys_iffeature *)0x0;
                      plVar8 = (lys_tpdf *)&plVar8->dsc) {
                    lys_iffeature_free(ctx,(lys_iffeature *)plVar8->name,'\x01');
                  }
                  goto LAB_00150eae;
                }
                lys_iffeature_free(ctx,(lys_iffeature *)tpdf,'\x01');
              }
              break;
            case LY_STMT_LENGTH:
            case LY_STMT_MUST:
            case LY_STMT_PATTERN:
            case LY_STMT_RANGE:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (stmt,(lys_ext_instance_complex *)local_38[local_40],
                                  (lyext_substmt **)0x0);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (tpdf = (lys_tpdf *)*puVar5, tpdf != (lys_tpdf *)0x0)) {
                plVar8 = tpdf;
                if (*(uint *)(plVar4->padding + lVar9 + -0xb) < 2) {
                  lys_restr_free(ctx,(lys_restr *)tpdf);
                  goto LAB_00150eab;
                }
                for (; (lys_restr *)plVar8->name != (lys_restr *)0x0;
                    plVar8 = (lys_tpdf *)&plVar8->dsc) {
                  lys_restr_free(ctx,(lys_restr *)plVar8->name);
                  free(plVar8->name);
                }
                goto LAB_00150eae;
              }
              break;
            case LY_STMT_WHEN:
              puVar5 = (undefined8 *)
                       lys_ext_complex_get_substmt
                                 (LY_STMT_WHEN,(lys_ext_instance_complex *)local_38[local_40],
                                  (lyext_substmt **)0x0);
              if ((puVar5 != (undefined8 *)0x0) &&
                 (tpdf = (lys_tpdf *)*puVar5, tpdf != (lys_tpdf *)0x0)) {
                plVar8 = tpdf;
                if (1 < *(uint *)(plVar4->padding + lVar9 + -0xb)) {
                  for (; (lys_when *)plVar8->name != (lys_when *)0x0;
                      plVar8 = (lys_tpdf *)&plVar8->dsc) {
                    lys_when_free(ctx,(lys_when *)plVar8->name);
                  }
                  goto LAB_00150eae;
                }
                lys_when_free(ctx,(lys_when *)tpdf);
              }
              break;
            case LY_STMT_REVISION:
              plVar6 = (long *)lys_ext_complex_get_substmt
                                         (LY_STMT_REVISION,
                                          (lys_ext_instance_complex *)local_38[local_40],
                                          (lyext_substmt **)0x0);
              if ((plVar6 != (long *)0x0) && (tpdf = (lys_tpdf *)*plVar6, tpdf != (lys_tpdf *)0x0))
              {
                plVar8 = tpdf;
                if (*(uint *)(plVar4->padding + lVar9 + -0xb) < 2) {
                  lydict_remove(ctx,*(char **)&tpdf->flags);
                  lydict_remove(ctx,*(char **)(*plVar6 + 0x20));
                  lys_extension_instances_free
                            (ctx,*(lys_ext_instance ***)(*plVar6 + 0x10),
                             (uint)*(byte *)(*plVar6 + 0xb));
                  tpdf = (lys_tpdf *)*plVar6;
                }
                else {
                  for (; plVar8->name != (char *)0x0; plVar8 = (lys_tpdf *)&plVar8->dsc) {
                    lydict_remove(ctx,*(char **)(plVar8->name + 0x18));
                    lydict_remove(ctx,*(char **)(plVar8->name + 0x20));
                    lys_extension_instances_free
                              (ctx,*(lys_ext_instance ***)(plVar8->name + 0x10),
                               (uint)(byte)plVar8->name[0xb]);
                    free(plVar8->name);
                  }
                }
                goto LAB_00150eae;
              }
            }
            local_44 = local_44 + 1;
          } while( true );
        }
        goto LAB_00150ef3;
      }
      goto LAB_00150ef8;
    }
    free(e);
  }
  return;
switchD_00150ee1_caseD_0:
  plVar10 = local_38[local_40];
  e = local_38;
  uVar11 = local_40;
  uVar12 = local_58;
LAB_00150ef3:
  free(plVar10);
LAB_00150ef8:
  uVar11 = uVar11 + 1;
  goto LAB_0015092f;
}

Assistant:

void
lys_extension_instances_free(struct ly_ctx *ctx, struct lys_ext_instance **e, unsigned int size)
{
    unsigned int i, j, k;
    struct lyext_substmt *substmt;
    void **pp, **start;
    struct lys_node *siter, *snext;

#define EXTCOMPLEX_FREE_STRUCT(STMT, TYPE, FUNC, FREE, ARGS...)                               \
    pp = lys_ext_complex_get_substmt(STMT, (struct lys_ext_instance_complex *)e[i], NULL);    \
    if (!pp || !(*pp)) { break; }                                                             \
    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */                    \
        for (start = pp = *pp; *pp; pp++) {                                                   \
            FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                 \
            if (FREE) { free(*pp); }                                                          \
        }                                                                                     \
        free(start);                                                                          \
    } else { /* single item */                                                                \
        FUNC(ctx, (TYPE *)(*pp), ##ARGS);                                                     \
        if (FREE) { free(*pp); }                                                              \
    }

    if (!size || !e || !(*e)) {
        return;
    }

    for (i = 0; i < size; i++) {
        if (!e[i]) {
            continue;
        }

        if (e[i]->flags & (LYEXT_OPT_INHERIT)) {
            /* no free, this is just a shadow copy of the original extension instance */
        } else {
            if (e[i]->flags & (LYEXT_OPT_YANG)) {
                free(e[i]->def);     /* remove name of instance extension */
                e[i]->def = NULL;
                yang_free_ext_data((struct yang_ext_substmt *)e[i]->parent); /* remove backup part of yang file */
            }
            lys_extension_instances_free(ctx, e[i]->ext, e[i]->ext_size);
            lydict_remove(ctx, e[i]->arg_value);
        }

        if (e[i]->def && e[i]->def->plugin && e[i]->def->plugin->type == LYEXT_COMPLEX) {
            substmt = ((struct lys_ext_instance_complex *)e[i])->substmt;
            for (j = 0; substmt[j].stmt; j++) {
                switch(substmt[j].stmt) {
                case LY_STMT_DESCRIPTION:
                case LY_STMT_REFERENCE:
                case LY_STMT_UNITS:
                case LY_STMT_ARGUMENT:
                case LY_STMT_DEFAULT:
                case LY_STMT_ERRTAG:
                case LY_STMT_ERRMSG:
                case LY_STMT_PREFIX:
                case LY_STMT_NAMESPACE:
                case LY_STMT_PRESENCE:
                case LY_STMT_REVISIONDATE:
                case LY_STMT_KEY:
                case LY_STMT_BASE:
                case LY_STMT_BELONGSTO:
                case LY_STMT_CONTACT:
                case LY_STMT_ORGANIZATION:
                case LY_STMT_PATH:
                    lys_extcomplex_free_str(ctx, (struct lys_ext_instance_complex *)e[i], substmt[j].stmt);
                    break;
                case LY_STMT_TYPE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPE, struct lys_type, lys_type_free, 1);
                    break;
                case LY_STMT_TYPEDEF:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_TYPEDEF, struct lys_tpdf, lys_tpdf_free, 1);
                    break;
                case LY_STMT_IFFEATURE:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_IFFEATURE, struct lys_iffeature, lys_iffeature_free, 0, 1);
                    break;
                case LY_STMT_MAX:
                case LY_STMT_MIN:
                case LY_STMT_POSITION:
                case LY_STMT_VALUE:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME && *pp) {
                        for(k = 0; ((uint32_t**)(*pp))[k]; k++) {
                            free(((uint32_t**)(*pp))[k]);
                        }
                    }
                    free(*pp);
                    break;
                case LY_STMT_DIGITS:
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_MODULE:
                    /* modules are part of the context, so they will be freed there */
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) {
                        /* free the array */
                        pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                        free(*pp);
                    }
                    break;
                case LY_STMT_ACTION:
                case LY_STMT_ANYDATA:
                case LY_STMT_ANYXML:
                case LY_STMT_CASE:
                case LY_STMT_CHOICE:
                case LY_STMT_CONTAINER:
                case LY_STMT_GROUPING:
                case LY_STMT_INPUT:
                case LY_STMT_LEAF:
                case LY_STMT_LEAFLIST:
                case LY_STMT_LIST:
                case LY_STMT_NOTIFICATION:
                case LY_STMT_OUTPUT:
                case LY_STMT_RPC:
                case LY_STMT_USES:
                    pp = (void**)&((struct lys_ext_instance_complex *)e[i])->content[substmt[j].offset];
                    LY_TREE_FOR_SAFE((struct lys_node *)(*pp), snext, siter) {
                        lys_node_free(siter, NULL, 0);
                    }
                    *pp = NULL;
                    break;
                case LY_STMT_UNIQUE:
                    pp = lys_ext_complex_get_substmt(LY_STMT_UNIQUE, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                                lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                            }
                            free((*(struct lys_unique**)pp)->expr);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        for (k = 0; k < (*(struct lys_unique**)pp)->expr_size; k++) {
                            lydict_remove(ctx, (*(struct lys_unique**)pp)->expr[k]);
                        }
                        free((*(struct lys_unique**)pp)->expr);
                        free(*pp);
                    }
                    break;
                case LY_STMT_LENGTH:
                case LY_STMT_MUST:
                case LY_STMT_PATTERN:
                case LY_STMT_RANGE:
                    EXTCOMPLEX_FREE_STRUCT(substmt[j].stmt, struct lys_restr, lys_restr_free, 1);
                    break;
                case LY_STMT_WHEN:
                    EXTCOMPLEX_FREE_STRUCT(LY_STMT_WHEN, struct lys_when, lys_when_free, 0);
                    break;
                case LY_STMT_REVISION:
                    pp = lys_ext_complex_get_substmt(LY_STMT_REVISION, (struct lys_ext_instance_complex *)e[i], NULL);
                    if (!pp || !(*pp)) {
                        break;
                    }
                    if (substmt[j].cardinality >= LY_STMT_CARD_SOME) { /* process array */
                        for (start = pp = *pp; *pp; pp++) {
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                            lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                            lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                         (*(struct lys_revision**)pp)->ext_size);
                            free(*pp);
                        }
                        free(start);
                    } else { /* single item */
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->dsc);
                        lydict_remove(ctx, (*(struct lys_revision**)pp)->ref);
                        lys_extension_instances_free(ctx, (*(struct lys_revision**)pp)->ext,
                                                     (*(struct lys_revision**)pp)->ext_size);
                        free(*pp);
                    }
                    break;
                default:
                    /* nothing to free */
                    break;
                }
            }
        }

        free(e[i]);
    }
    free(e);

#undef EXTCOMPLEX_FREE_STRUCT
}